

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pushDownWhereTerms(Parse *pParse,Select *pSubq,Expr *pWhere,SrcItem *pSrc)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  Select *pSel;
  Select *pSVar4;
  Expr *pEVar5;
  int iVar6;
  ulong uVar7;
  SubstContext x;
  
  iVar6 = 0;
  iVar2 = 0;
  if (((pWhere != (Expr *)0x0) && (iVar2 = iVar6, (pSubq->selFlags & 0x2002000) == 0)) &&
     (((pSrc->fg).jointype & 0x50) == 0)) {
    pSVar4 = pSubq;
    if (pSubq->pPrior == (Select *)0x0) {
      if ((pSubq->pWin != (Window *)0x0) && (pSubq->pWin->pPartition == (ExprList *)0x0)) {
        return 0;
      }
    }
    else {
      for (; pSVar4 != (Select *)0x0; pSVar4 = pSVar4->pPrior) {
        if ((pSVar4->op != 0x8a) && (pSVar4->op != 0x87)) {
          return 0;
        }
        if (pSVar4->pWin != (Window *)0x0) {
          return 0;
        }
      }
    }
    if (pSubq->pLimit == (Expr *)0x0) {
      iVar6 = 0;
      for (; pWhere->op == ','; pWhere = pWhere->pLeft) {
        iVar2 = pushDownWhereTerms(pParse,pSubq,pWhere->pRight,pSrc);
        iVar6 = iVar6 + iVar2;
      }
      iVar3 = sqlite3ExprIsTableConstraint(pWhere,pSrc);
      iVar2 = iVar6;
      if (iVar3 != 0) {
        pbVar1 = (byte *)((long)&pSubq->selFlags + 3);
        *pbVar1 = *pbVar1 | 1;
        iVar2 = iVar6 + 1;
        for (; pSubq != (Select *)0x0; pSubq = pSubq->pPrior) {
          pEVar5 = sqlite3ExprDup(pParse->db,pWhere,0);
          unsetJoinExpr(pEVar5,-1,1);
          x.iTable = pSrc->iCursor;
          x.isOuterJoin = 0;
          x.pEList = pSubq->pEList;
          x.pParse = pParse;
          x.iNewTable = x.iTable;
          x.pCList = findLeftmostExprlist(pSubq);
          pEVar5 = substExpr(&x,pEVar5);
          if ((pSubq->pWin != (Window *)0x0) &&
             (iVar3 = sqlite3ExprIsConstantOrGroupBy(pParse,pEVar5,pSubq->pWin->pPartition),
             iVar3 == 0)) {
            sqlite3ExprDelete(pParse->db,pEVar5);
            return iVar6;
          }
          uVar7 = (ulong)(pSubq->selFlags & 8);
          pEVar5 = sqlite3ExprAnd(pParse,*(Expr **)((long)pSubq->addrOpenEphm + uVar7 * 2 + 0x1c),
                                  pEVar5);
          *(Expr **)((long)pSubq->addrOpenEphm + uVar7 * 2 + 0x1c) = pEVar5;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int pushDownWhereTerms(
  Parse *pParse,        /* Parse context (for malloc() and error reporting) */
  Select *pSubq,        /* The subquery whose WHERE clause is to be augmented */
  Expr *pWhere,         /* The WHERE clause of the outer query */
  SrcItem *pSrc         /* The subquery term of the outer FROM clause */
){
  Expr *pNew;
  int nChng = 0;
  if( pWhere==0 ) return 0;
  if( pSubq->selFlags & (SF_Recursive|SF_MultiPart) ) return 0;
  if( pSrc->fg.jointype & (JT_LTORJ|JT_RIGHT) ) return 0;

#ifndef SQLITE_OMIT_WINDOWFUNC
  if( pSubq->pPrior ){
    Select *pSel;
    for(pSel=pSubq; pSel; pSel=pSel->pPrior){
      u8 op = pSel->op;
      assert( op==TK_ALL || op==TK_SELECT
           || op==TK_UNION || op==TK_INTERSECT || op==TK_EXCEPT );
      if( op!=TK_ALL && op!=TK_SELECT ) return 0;  /* restriction (8) */
      if( pSel->pWin ) return 0;    /* restriction (6b) */
    }
  }else{
    if( pSubq->pWin && pSubq->pWin->pPartition==0 ) return 0;
  }
#endif

#ifdef SQLITE_DEBUG
  /* Only the first term of a compound can have a WITH clause.  But make
  ** sure no other terms are marked SF_Recursive in case something changes
  ** in the future.
  */
  {
    Select *pX;
    for(pX=pSubq; pX; pX=pX->pPrior){
      assert( (pX->selFlags & (SF_Recursive))==0 );
    }
  }
#endif

  if( pSubq->pLimit!=0 ){
    return 0; /* restriction (3) */
  }
  while( pWhere->op==TK_AND ){
    nChng += pushDownWhereTerms(pParse, pSubq, pWhere->pRight, pSrc);
    pWhere = pWhere->pLeft;
  }

#if 0  /* Legacy code. Checks now done by sqlite3ExprIsTableConstraint() */
  if( isLeftJoin
   && (ExprHasProperty(pWhere,EP_OuterON)==0
         || pWhere->w.iJoin!=iCursor)
  ){
    return 0; /* restriction (4) */
  }
  if( ExprHasProperty(pWhere,EP_OuterON)
   && pWhere->w.iJoin!=iCursor
  ){
    return 0; /* restriction (5) */
  }
#endif

  if( sqlite3ExprIsTableConstraint(pWhere, pSrc) ){
    nChng++;
    pSubq->selFlags |= SF_PushDown;
    while( pSubq ){
      SubstContext x;
      pNew = sqlite3ExprDup(pParse->db, pWhere, 0);
      unsetJoinExpr(pNew, -1, 1);
      x.pParse = pParse;
      x.iTable = pSrc->iCursor;
      x.iNewTable = pSrc->iCursor;
      x.isOuterJoin = 0;
      x.pEList = pSubq->pEList;
      x.pCList = findLeftmostExprlist(pSubq);
      pNew = substExpr(&x, pNew);
#ifndef SQLITE_OMIT_WINDOWFUNC
      if( pSubq->pWin && 0==pushDownWindowCheck(pParse, pSubq, pNew) ){
        /* Restriction 6c has prevented push-down in this case */
        sqlite3ExprDelete(pParse->db, pNew);
        nChng--;
        break;
      }
#endif
      if( pSubq->selFlags & SF_Aggregate ){
        pSubq->pHaving = sqlite3ExprAnd(pParse, pSubq->pHaving, pNew);
      }else{
        pSubq->pWhere = sqlite3ExprAnd(pParse, pSubq->pWhere, pNew);
      }
      pSubq = pSubq->pPrior;
    }
  }
  return nChng;
}